

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Type * __thiscall
slang::ast::GenericClassDefSymbol::getDefaultSpecialization(GenericClassDefSymbol *this)

{
  bool bVar1;
  Type **ppTVar2;
  Type *scope_00;
  LookupLocation lookupLocation;
  _Storage<const_slang::ast::Type_*,_true> local_90;
  undefined8 local_88;
  SourceLocation local_80;
  bitmask<slang::ast::ASTFlags> local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  ASTContext local_60;
  GenericClassDefSymbol *local_28;
  Type *result;
  Scope *scope;
  GenericClassDefSymbol *this_local;
  
  scope = (Scope *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->defaultSpecialization);
  if (bVar1) {
    ppTVar2 = std::optional<const_slang::ast::Type_*>::operator*(&this->defaultSpecialization);
    this_local = (GenericClassDefSymbol *)*ppTVar2;
  }
  else {
    scope_00 = (Type *)Symbol::getParentScope(&this->super_Symbol);
    result = scope_00;
    if (scope_00 == (Type *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ClassSymbols.cpp"
                 ,0x2e2,
                 "const Type *slang::ast::GenericClassDefSymbol::getDefaultSpecialization() const");
    }
    local_70 = LookupLocation::max;
    local_68 = (undefined4)DAT_0091b918;
    uStack_64 = (undefined4)((ulong)DAT_0091b918 >> 0x20);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_78,None);
    lookupLocation.index = local_68;
    lookupLocation.scope = (Scope *)local_70;
    lookupLocation._12_4_ = 0;
    ASTContext::ASTContext(&local_60,(Scope *)scope_00,lookupLocation,local_78);
    local_80 = (this->super_Symbol).location;
    local_28 = (GenericClassDefSymbol *)
               getSpecializationImpl
                         (this,&local_60,local_80,false,(ParameterValueAssignmentSyntax *)0x0);
    std::optional<const_slang::ast::Type_*>::optional<const_slang::ast::Type_*&,_true>
              ((optional<const_slang::ast::Type_*> *)&local_90,(Type **)&local_28);
    (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_payload = local_90;
    *(undefined8 *)
     &(this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = local_88;
    this_local = local_28;
  }
  return (Type *)this_local;
}

Assistant:

const Type* GenericClassDefSymbol::getDefaultSpecialization() const {
    if (defaultSpecialization)
        return *defaultSpecialization;

    auto scope = getParentScope();
    ASSERT(scope);

    auto result = getSpecializationImpl(ASTContext(*scope, LookupLocation::max), location,
                                        /* forceInvalidParams */ false, nullptr);
    defaultSpecialization = result;
    return result;
}